

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O3

void __thiscall duckdb::Relation::Delete(Relation *this,string *condition)

{
  InvalidInputException *this_00;
  string local_40;
  
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"DELETE can only be used on base tables!","");
  InvalidInputException::InvalidInputException(this_00,&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Relation::Delete(const string &condition) {
	throw InvalidInputException("DELETE can only be used on base tables!");
}